

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

int HRSS_generate_key(HRSS_public_key *out_pub,HRSS_private_key *out_priv,uint8_t *in)

{
  POLY_MUL_SCRATCH *scratch;
  uint local_4c;
  uint i;
  vars *vars;
  void *malloc_ptr;
  private_key *priv;
  public_key *pub;
  uint8_t *in_local;
  HRSS_private_key *out_priv_local;
  HRSS_public_key *out_pub_local;
  
  pub = (public_key *)in;
  in_local = out_priv->opaque;
  out_priv_local = (HRSS_private_key *)out_pub;
  priv = (private_key *)public_key_from_external(out_pub);
  malloc_ptr = private_key_from_external((HRSS_private_key *)in_local);
  scratch = (POLY_MUL_SCRATCH *)malloc_align32(&vars,0x9ce0);
  if (scratch == (POLY_MUL_SCRATCH *)0x0) {
    memset(out_priv_local,0,0x590);
    RAND_bytes(in_local,0x710);
    out_pub_local._4_4_ = 0;
  }
  else {
    OPENSSL_memset(scratch,0xff,0x9ce0);
    OPENSSL_memcpy((void *)((long)malloc_ptr + 0x6e0),(void *)((long)&(pub->ph).field_0 + 0x578),
                   0x20);
    poly_short_sample_plus((poly *)(scratch + 1),(uint8_t *)pub);
    poly3_from_poly((poly3 *)malloc_ptr,(poly *)(scratch + 1));
    HRSS_poly3_invert((poly3 *)((long)malloc_ptr + 0xb0),(poly3 *)malloc_ptr);
    poly_short_sample_plus
              ((poly *)((long)&scratch[1].u + 0x580),(uint8_t *)((pub->ph).field_0.v + 0x15e));
    for (local_4c = 0; local_4c < 0x2bd; local_4c = local_4c + 1) {
      *(short *)((long)&scratch[1].u + (ulong)local_4c * 2 + 0x580) =
           *(short *)((long)&scratch[1].u + (ulong)local_4c * 2 + 0x580) * 3;
    }
    poly_mul_x_minus_1((poly *)((long)&scratch[1].u + 0x580));
    poly_mul(scratch,(poly *)((long)&scratch[1].u + 0xb00),(poly *)(scratch + 1),
             (poly *)((long)&scratch[1].u + 0x580));
    poly_invert(scratch,(poly *)((long)&scratch[1].u + 0x1080),(poly *)((long)&scratch[1].u + 0xb00)
               );
    poly_mul(scratch,(poly *)priv,(poly *)((long)&scratch[1].u + 0x1080),
             (poly *)((long)&scratch[1].u + 0x580));
    poly_mul(scratch,(poly *)priv,(poly *)priv,(poly *)((long)&scratch[1].u + 0x580));
    poly_clamp((poly *)priv);
    poly_mul(scratch,(poly *)((long)malloc_ptr + 0x160),(poly *)((long)&scratch[1].u + 0x1080),
             (poly *)(scratch + 1));
    poly_mul(scratch,(poly *)((long)malloc_ptr + 0x160),(poly *)((long)malloc_ptr + 0x160),
             (poly *)(scratch + 1));
    poly_clamp((poly *)((long)malloc_ptr + 0x160));
    OPENSSL_free(vars);
    out_pub_local._4_4_ = 1;
  }
  return out_pub_local._4_4_;
}

Assistant:

int HRSS_generate_key(
    struct HRSS_public_key *out_pub, struct HRSS_private_key *out_priv,
    const uint8_t in[HRSS_SAMPLE_BYTES + HRSS_SAMPLE_BYTES + 32]) {
  struct public_key *pub = public_key_from_external(out_pub);
  struct private_key *priv = private_key_from_external(out_priv);

  struct vars {
    struct POLY_MUL_SCRATCH scratch;
    struct poly f;
    struct poly pg_phi1;
    struct poly pfg_phi1;
    struct poly pfg_phi1_inverse;
  };

  void *malloc_ptr;
  struct vars *const vars = reinterpret_cast<struct vars *>(
      malloc_align32(&malloc_ptr, sizeof(struct vars)));
  if (!vars) {
    // If the caller ignores the return value the output will still be safe.
    // The private key output is randomised in case it's later passed to
    // |HRSS_encap|.
    memset(out_pub, 0, sizeof(struct HRSS_public_key));
    RAND_bytes((uint8_t *)out_priv, sizeof(struct HRSS_private_key));
    return 0;
  }

#if !defined(NDEBUG)
  OPENSSL_memset(vars, 0xff, sizeof(struct vars));
#endif

  OPENSSL_memcpy(priv->hmac_key, in + 2 * HRSS_SAMPLE_BYTES,
                 sizeof(priv->hmac_key));

  poly_short_sample_plus(&vars->f, in);
  poly3_from_poly(&priv->f, &vars->f);
  HRSS_poly3_invert(&priv->f_inverse, &priv->f);

  // pg_phi1 is p (i.e. 3) × g × Φ(1) (i.e. 𝑥-1).
  poly_short_sample_plus(&vars->pg_phi1, in + HRSS_SAMPLE_BYTES);
  for (unsigned i = 0; i < N; i++) {
    vars->pg_phi1.v[i] *= 3;
  }
  poly_mul_x_minus_1(&vars->pg_phi1);

  poly_mul(&vars->scratch, &vars->pfg_phi1, &vars->f, &vars->pg_phi1);

  poly_invert(&vars->scratch, &vars->pfg_phi1_inverse, &vars->pfg_phi1);

  poly_mul(&vars->scratch, &pub->ph, &vars->pfg_phi1_inverse, &vars->pg_phi1);
  poly_mul(&vars->scratch, &pub->ph, &pub->ph, &vars->pg_phi1);
  poly_clamp(&pub->ph);

  poly_mul(&vars->scratch, &priv->ph_inverse, &vars->pfg_phi1_inverse,
           &vars->f);
  poly_mul(&vars->scratch, &priv->ph_inverse, &priv->ph_inverse, &vars->f);
  poly_clamp(&priv->ph_inverse);

  OPENSSL_free(malloc_ptr);
  return 1;
}